

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O2

void gf256_muladd_mem(void *vz,uint8_t y,void *vx,int bytes)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 *puVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  int iVar14;
  uint uVar15;
  undefined7 in_register_00000031;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  if (y < 2) {
    if (y == '\x01') {
      gf256_add_mem(vz,vx,bytes);
      return;
    }
    return;
  }
  iVar14 = (int)CONCAT71(in_register_00000031,y);
  if (bytes < 0x20) {
LAB_001655eb:
    if (bytes < 0x10) goto LAB_001656c1;
  }
  else if (CpuHasAVX2) {
    auVar22[8] = 0xf;
    auVar22._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar22[9] = 0xf;
    auVar22[10] = 0xf;
    auVar22[0xb] = 0xf;
    auVar22[0xc] = 0xf;
    auVar22[0xd] = 0xf;
    auVar22[0xe] = 0xf;
    auVar22[0xf] = 0xf;
    auVar22[0x10] = 0xf;
    auVar22[0x11] = 0xf;
    auVar22[0x12] = 0xf;
    auVar22[0x13] = 0xf;
    auVar22[0x14] = 0xf;
    auVar22[0x15] = 0xf;
    auVar22[0x16] = 0xf;
    auVar22[0x17] = 0xf;
    auVar22[0x18] = 0xf;
    auVar22[0x19] = 0xf;
    auVar22[0x1a] = 0xf;
    auVar22[0x1b] = 0xf;
    auVar22[0x1c] = 0xf;
    auVar22[0x1d] = 0xf;
    auVar22[0x1e] = 0xf;
    auVar22[0x1f] = 0xf;
    auVar20 = *(undefined1 (*) [32])
               ((long)GF256Ctx.MM256.TABLE_LO_Y[0] + (ulong)(uint)(iVar14 << 5));
    auVar4 = *(undefined1 (*) [32])((long)GF256Ctx.MM256.TABLE_HI_Y[0] + (ulong)(uint)(iVar14 << 5))
    ;
    for (uVar16 = 0; (bytes & 0xffffffc0) != uVar16; uVar16 = uVar16 + 0x40) {
      auVar24 = vpsrlq_avx2(*(undefined1 (*) [32])((long)vx + uVar16),4);
      auVar19 = vpand_avx2(*(undefined1 (*) [32])((long)vx + uVar16),auVar22);
      auVar18 = vpshufb_avx2(auVar20,auVar19);
      auVar19 = vpand_avx2(auVar24,auVar22);
      auVar19 = vpshufb_avx2(auVar4,auVar19);
      auVar18 = vpternlogq_avx512vl(auVar19,auVar18,*(undefined1 (*) [32])((long)vz + uVar16),0x96);
      auVar19 = *(undefined1 (*) [32])((long)vx + uVar16 + 0x20);
      *(undefined1 (*) [32])((long)vz + uVar16) = auVar18;
      auVar24 = vpsrlq_avx2(auVar19,4);
      auVar19 = vpand_avx2(auVar19,auVar22);
      auVar18 = vpshufb_avx2(auVar20,auVar19);
      auVar19 = vpand_avx2(auVar24,auVar22);
      auVar19 = vpshufb_avx2(auVar4,auVar19);
      auVar19 = vpternlogq_avx512vl(auVar19,auVar18,*(undefined1 (*) [32])((long)vz + uVar16 + 0x20)
                                    ,0x96);
      *(undefined1 (*) [32])((long)vz + uVar16 + 0x20) = auVar19;
    }
    uVar15 = bytes & 0xffffffc0;
    bytes = bytes & 0x3f;
    vz = (void *)((long)vz + (ulong)uVar15);
    vx = (void *)((long)vx + (ulong)uVar15);
    if (0x1f < (uint)bytes) {
      auVar19 = *vx;
      bytes = bytes - 0x20;
      vx = (void *)((long)vx + 0x20);
      auVar18 = vpsrlq_avx2(auVar19,4);
      auVar19 = vpand_avx2(auVar19,auVar22);
      auVar19 = vpshufb_avx2(auVar20,auVar19);
      auVar20 = vpand_avx2(auVar18,auVar22);
      auVar20 = vpshufb_avx2(auVar4,auVar20);
      auVar20 = vpternlogq_avx512vl(auVar20,auVar19,*vz,0x96);
      *(undefined1 (*) [32])vz = auVar20;
      vz = (void *)((long)vz + 0x20);
    }
    goto LAB_001655eb;
  }
  if (CpuHasSSSE3 == true) {
    auVar21[8] = 0xf;
    auVar21._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar21[9] = 0xf;
    auVar21[10] = 0xf;
    auVar21[0xb] = 0xf;
    auVar21[0xc] = 0xf;
    auVar21[0xd] = 0xf;
    auVar21[0xe] = 0xf;
    auVar21[0xf] = 0xf;
    auVar2 = *(undefined1 (*) [16])((long)GF256Ctx.MM128.TABLE_LO_Y[0] + (ulong)(uint)(iVar14 << 4))
    ;
    auVar3 = *(undefined1 (*) [16])((long)GF256Ctx.MM128.TABLE_HI_Y[0] + (ulong)(uint)(iVar14 << 4))
    ;
    while (0x1f < (uint)bytes) {
      puVar6 = *(undefined1 (*) [32])vx;
      puVar7 = *(undefined1 (*) [32])vx;
      bytes = bytes - 0x20;
      vx = (void *)((long)vx + 0x20);
      auVar25 = vpsrlq_avx(*(undefined1 (*) [16])(puVar6 + 0x10),4);
      auVar17 = vpand_avx(*(undefined1 (*) [16])(puVar6 + 0x10),auVar21);
      auVar26 = vpsrlq_avx(*(undefined1 (*) [16])puVar7,4);
      auVar5 = vpand_avx(*(undefined1 (*) [16])puVar7,auVar21);
      auVar23 = vpshufb_avx(auVar2,auVar17);
      auVar17 = vpand_avx(auVar25,auVar21);
      auVar25 = vpshufb_avx(auVar2,auVar5);
      auVar5 = vpand_avx(auVar26,auVar21);
      auVar17 = vpshufb_avx(auVar3,auVar17);
      auVar5 = vpshufb_avx(auVar3,auVar5);
      auVar17 = vpternlogq_avx512vl(auVar17,auVar23,
                                    *(undefined1 (*) [16])(*(undefined1 (*) [32])vz + 0x10),0x96);
      *(undefined1 (*) [16])(*(undefined1 (*) [32])vz + 0x10) = auVar17;
      auVar17 = vpternlogq_avx512vl(auVar5,auVar25,*(undefined1 (*) [16])*(undefined1 (*) [32])vz,
                                    0x96);
      *(undefined1 (*) [16])*(undefined1 (*) [32])vz = auVar17;
      vz = (void *)((long)vz + 0x20);
    }
    while (0xf < bytes) {
      puVar6 = *(undefined1 (*) [32])vx;
      bytes = bytes - 0x10;
      vx = *(undefined1 (*) [32])vx + 0x10;
      auVar23 = vpsrlq_avx(*(undefined1 (*) [16])puVar6,4);
      auVar17 = vpand_avx(*(undefined1 (*) [16])puVar6,auVar21);
      auVar5 = vpshufb_avx(auVar2,auVar17);
      auVar17 = vpand_avx(auVar23,auVar21);
      auVar17 = vpshufb_avx(auVar3,auVar17);
      auVar17 = vpternlogq_avx512vl(auVar17,auVar5,*(undefined1 (*) [16])*(undefined1 (*) [32])vz,
                                    0x96);
      *(undefined1 (*) [16])*(undefined1 (*) [32])vz = auVar17;
      vz = *(undefined1 (*) [32])vz + 0x10;
    }
  }
LAB_001656c1:
  lVar1 = (ulong)(uint)(iVar14 << 8) + 0x1a42e0;
  for (; 7 < bytes; bytes = bytes - 8) {
    puVar6 = *(undefined1 (*) [32])vx;
    puVar7 = *(undefined1 (*) [32])vx;
    puVar8 = *(undefined1 (*) [32])vx;
    puVar9 = *(undefined1 (*) [32])vx;
    puVar10 = *(undefined1 (*) [32])vx;
    puVar11 = *(undefined1 (*) [32])vx;
    puVar12 = *(undefined1 (*) [32])vx;
    puVar13 = *(undefined1 (*) [32])vx;
    vx = *(undefined1 (*) [32])vx + 8;
    *(ulong *)*(undefined1 (*) [32])vz =
         *(ulong *)*(undefined1 (*) [32])vz ^
         CONCAT17(*(undefined1 *)(lVar1 + (ulong)(byte)puVar13[7]),
                  CONCAT16(*(undefined1 *)(lVar1 + (ulong)(byte)puVar12[6]),
                           CONCAT15(*(undefined1 *)(lVar1 + (ulong)(byte)puVar11[5]),
                                    CONCAT14(*(undefined1 *)(lVar1 + (ulong)(byte)puVar10[4]),
                                             CONCAT13(*(undefined1 *)
                                                       (lVar1 + (ulong)(byte)puVar9[3]),
                                                      CONCAT12(*(undefined1 *)
                                                                (lVar1 + (ulong)(byte)puVar8[2]),
                                                               CONCAT11(*(undefined1 *)
                                                                         (lVar1 + (ulong)(byte)
                                                  puVar6[1]),
                                                  *(undefined1 *)(lVar1 + (ulong)(byte)*puVar7))))))
                          ));
    vz = *(undefined1 (*) [32])vz + 8;
  }
  if ((bytes & 4U) != 0) {
    *(uint *)*(undefined1 (*) [32])vz =
         *(uint *)*(undefined1 (*) [32])vz ^
         CONCAT13(*(undefined1 *)(lVar1 + (ulong)(byte)(*(undefined1 (*) [32])vx)[3]),
                  CONCAT12(*(undefined1 *)(lVar1 + (ulong)(byte)(*(undefined1 (*) [32])vx)[2]),
                           CONCAT11(*(undefined1 *)
                                     (lVar1 + (ulong)(byte)(*(undefined1 (*) [32])vx)[1]),
                                    *(undefined1 *)
                                     (lVar1 + (ulong)(byte)(*(undefined1 (*) [32])vx)[0]))));
  }
  switch(bytes & 3) {
  case 0:
    return;
  case 3:
    (*(undefined1 (*) [32])vz)[(ulong)(bytes & 4) + 2] =
         (*(undefined1 (*) [32])vz)[(ulong)(bytes & 4) + 2] ^
         *(byte *)(lVar1 + (ulong)(byte)(*(undefined1 (*) [32])vx)[(ulong)(bytes & 4) + 2]);
  case 2:
    (*(undefined1 (*) [32])vz)[(ulong)(bytes & 4) + 1] =
         (*(undefined1 (*) [32])vz)[(ulong)(bytes & 4) + 1] ^
         *(byte *)(lVar1 + (ulong)(byte)(*(undefined1 (*) [32])vx)[(ulong)(bytes & 4) + 1]);
  case 1:
    (*(undefined1 (*) [32])vz)[bytes & 4U] =
         (*(undefined1 (*) [32])vz)[bytes & 4U] ^
         *(byte *)(lVar1 + (ulong)(byte)(*(undefined1 (*) [32])vx)[bytes & 4U]);
    return;
  }
}

Assistant:

void gf256_muladd_mem(void * GF256_RESTRICT vz, uint8_t y,
                                 const void * GF256_RESTRICT vx, int bytes)
{
    // Use a single if-statement to handle special cases
    if (y <= 1)
    {
        if (y == 1)
            gf256_add_mem(vz, vx, bytes);
        return;
    }

    GF256_M128 * GF256_RESTRICT z16 = reinterpret_cast<GF256_M128 *>(vz);
    const GF256_M128 * GF256_RESTRICT x16 = reinterpret_cast<const GF256_M128 *>(vx);

#if defined(GF256_TARGET_MOBILE)
#if defined(GF256_TRY_NEON)
    if (bytes >= 16 && CpuHasNeon)
    {
        // Partial product tables; see above
        const GF256_M128 table_lo_y = vld1q_u8((uint8_t*)(GF256Ctx.MM128.TABLE_LO_Y + y));
        const GF256_M128 table_hi_y = vld1q_u8((uint8_t*)(GF256Ctx.MM128.TABLE_HI_Y + y));

        // clr_mask = 0x0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f
        const GF256_M128 clr_mask = vdupq_n_u8(0x0f);

        // Handle multiples of 16 bytes
        do
        {
            // See above comments for details
            GF256_M128 x0 = vld1q_u8((uint8_t*)x16);
            GF256_M128 l0 = vandq_u8(x0, clr_mask);

            // x0 = vshrq_n_u8(x0, 4);
            x0 = (GF256_M128)vshrq_n_u64( (uint64x2_t)x0, 4);
            GF256_M128 h0 = vandq_u8(x0, clr_mask);
            l0 = vqtbl1q_u8(table_lo_y, l0);
            h0 = vqtbl1q_u8(table_hi_y, h0);
            const GF256_M128 p0 = veorq_u8(l0, h0);
            const GF256_M128 z0 = vld1q_u8((uint8_t*)z16);
            vst1q_u8((uint8_t*)z16, veorq_u8(p0, z0));
            bytes -= 16, ++x16, ++z16;
        } while (bytes >= 16);
    }
#endif
#else // GF256_TARGET_MOBILE
# if defined(GF256_TRY_AVX2)
    if (bytes >= 32 && CpuHasAVX2)
    {
        // Partial product tables; see above
        const GF256_M256 table_lo_y = _mm256_loadu_si256(GF256Ctx.MM256.TABLE_LO_Y + y);
        const GF256_M256 table_hi_y = _mm256_loadu_si256(GF256Ctx.MM256.TABLE_HI_Y + y);

        // clr_mask = 0x0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f
        const GF256_M256 clr_mask = _mm256_set1_epi8(0x0f);

        GF256_M256 * GF256_RESTRICT z32 = reinterpret_cast<GF256_M256 *>(z16);
        const GF256_M256 * GF256_RESTRICT x32 = reinterpret_cast<const GF256_M256 *>(x16);

        // On my Reed Solomon codec, the encoder unit test runs in 640 usec without and 550 usec with the optimization (86% of the original time)
        const unsigned count = bytes / 64;
        for (unsigned i = 0; i < count; ++i)
        {
            // See above comments for details
            GF256_M256 x0 = _mm256_loadu_si256(x32 + i * 2);
            GF256_M256 l0 = _mm256_and_si256(x0, clr_mask);
            x0 = _mm256_srli_epi64(x0, 4);
            const GF256_M256 z0 = _mm256_loadu_si256(z32 + i * 2);
            GF256_M256 h0 = _mm256_and_si256(x0, clr_mask);
            l0 = _mm256_shuffle_epi8(table_lo_y, l0);
            h0 = _mm256_shuffle_epi8(table_hi_y, h0);
            const GF256_M256 p0 = _mm256_xor_si256(l0, h0);
            _mm256_storeu_si256(z32 + i * 2, _mm256_xor_si256(p0, z0));

            GF256_M256 x1 = _mm256_loadu_si256(x32 + i * 2 + 1);
            GF256_M256 l1 = _mm256_and_si256(x1, clr_mask);
            x1 = _mm256_srli_epi64(x1, 4);
            const GF256_M256 z1 = _mm256_loadu_si256(z32 + i * 2 + 1);
            GF256_M256 h1 = _mm256_and_si256(x1, clr_mask);
            l1 = _mm256_shuffle_epi8(table_lo_y, l1);
            h1 = _mm256_shuffle_epi8(table_hi_y, h1);
            const GF256_M256 p1 = _mm256_xor_si256(l1, h1);
            _mm256_storeu_si256(z32 + i * 2 + 1, _mm256_xor_si256(p1, z1));
        }
        bytes -= count * 64;
        z32 += count * 2;
        x32 += count * 2;

        if (bytes >= 32)
        {
            GF256_M256 x0 = _mm256_loadu_si256(x32);
            GF256_M256 l0 = _mm256_and_si256(x0, clr_mask);
            x0 = _mm256_srli_epi64(x0, 4);
            GF256_M256 h0 = _mm256_and_si256(x0, clr_mask);
            l0 = _mm256_shuffle_epi8(table_lo_y, l0);
            h0 = _mm256_shuffle_epi8(table_hi_y, h0);
            const GF256_M256 p0 = _mm256_xor_si256(l0, h0);
            const GF256_M256 z0 = _mm256_loadu_si256(z32);
            _mm256_storeu_si256(z32, _mm256_xor_si256(p0, z0));

            bytes -= 32;
            z32++;
            x32++;
        }

        z16 = reinterpret_cast<GF256_M128 *>(z32);
        x16 = reinterpret_cast<const GF256_M128 *>(x32);
    }
# endif // GF256_TRY_AVX2
    if (bytes >= 16 && CpuHasSSSE3)
    {
        // Partial product tables; see above
        const GF256_M128 table_lo_y = _mm_loadu_si128(GF256Ctx.MM128.TABLE_LO_Y + y);
        const GF256_M128 table_hi_y = _mm_loadu_si128(GF256Ctx.MM128.TABLE_HI_Y + y);

        // clr_mask = 0x0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f
        const GF256_M128 clr_mask = _mm_set1_epi8(0x0f);

        // This unroll seems to provide about 7% speed boost when AVX2 is disabled
        while (bytes >= 32)
        {
            bytes -= 32;

            GF256_M128 x1 = _mm_loadu_si128(x16 + 1);
            GF256_M128 l1 = _mm_and_si128(x1, clr_mask);
            x1 = _mm_srli_epi64(x1, 4);
            GF256_M128 h1 = _mm_and_si128(x1, clr_mask);
            l1 = _mm_shuffle_epi8(table_lo_y, l1);
            h1 = _mm_shuffle_epi8(table_hi_y, h1);
            const GF256_M128 z1 = _mm_loadu_si128(z16 + 1);

            GF256_M128 x0 = _mm_loadu_si128(x16);
            GF256_M128 l0 = _mm_and_si128(x0, clr_mask);
            x0 = _mm_srli_epi64(x0, 4);
            GF256_M128 h0 = _mm_and_si128(x0, clr_mask);
            l0 = _mm_shuffle_epi8(table_lo_y, l0);
            h0 = _mm_shuffle_epi8(table_hi_y, h0);
            const GF256_M128 z0 = _mm_loadu_si128(z16);

            const GF256_M128 p1 = _mm_xor_si128(l1, h1);
            _mm_storeu_si128(z16 + 1, _mm_xor_si128(p1, z1));

            const GF256_M128 p0 = _mm_xor_si128(l0, h0);
            _mm_storeu_si128(z16, _mm_xor_si128(p0, z0));

            x16 += 2, z16 += 2;
        }

        // Handle multiples of 16 bytes
        while (bytes >= 16)
        {
            // See above comments for details
            GF256_M128 x0 = _mm_loadu_si128(x16);
            GF256_M128 l0 = _mm_and_si128(x0, clr_mask);
            x0 = _mm_srli_epi64(x0, 4);
            GF256_M128 h0 = _mm_and_si128(x0, clr_mask);
            l0 = _mm_shuffle_epi8(table_lo_y, l0);
            h0 = _mm_shuffle_epi8(table_hi_y, h0);
            const GF256_M128 p0 = _mm_xor_si128(l0, h0);
            const GF256_M128 z0 = _mm_loadu_si128(z16);
            _mm_storeu_si128(z16, _mm_xor_si128(p0, z0));

            bytes -= 16, ++x16, ++z16;
        }
    }
#endif // GF256_TARGET_MOBILE

    uint8_t * GF256_RESTRICT z1 = reinterpret_cast<uint8_t*>(z16);
    const uint8_t * GF256_RESTRICT x1 = reinterpret_cast<const uint8_t*>(x16);
    const uint8_t * GF256_RESTRICT table = GF256Ctx.GF256_MUL_TABLE + ((unsigned)y << 8);

    // Handle blocks of 8 bytes
    while (bytes >= 8)
    {
        uint64_t * GF256_RESTRICT z8 = reinterpret_cast<uint64_t *>(z1);
#ifdef GF256_IS_BIG_ENDIAN
        uint64_t word = (uint64_t)table[x1[0]] << 56;
        word |= (uint64_t)table[x1[1]] << 48;
        word |= (uint64_t)table[x1[2]] << 40;
        word |= (uint64_t)table[x1[3]] << 32;
        word |= (uint64_t)table[x1[4]] << 24;
        word |= (uint64_t)table[x1[5]] << 16;
        word |= (uint64_t)table[x1[6]] << 8;
        word |= (uint64_t)table[x1[7]];
#else
        uint64_t word = table[x1[0]];
        word |= (uint64_t)table[x1[1]] << 8;
        word |= (uint64_t)table[x1[2]] << 16;
        word |= (uint64_t)table[x1[3]] << 24;
        word |= (uint64_t)table[x1[4]] << 32;
        word |= (uint64_t)table[x1[5]] << 40;
        word |= (uint64_t)table[x1[6]] << 48;
        word |= (uint64_t)table[x1[7]] << 56;
#endif
        *z8 ^= word;

        bytes -= 8, x1 += 8, z1 += 8;
    }

    // Handle a block of 4 bytes
    const int four = bytes & 4;
    if (four)
    {
        uint32_t * GF256_RESTRICT z4 = reinterpret_cast<uint32_t *>(z1);
#ifdef GF256_IS_BIG_ENDIAN
        uint32_t word = (uint32_t)table[x1[0]] << 24;
        word |= (uint32_t)table[x1[1]] << 16;
        word |= (uint32_t)table[x1[2]] << 8;
        word |= (uint32_t)table[x1[3]];
#else
        uint32_t word = table[x1[0]];
        word |= (uint32_t)table[x1[1]] << 8;
        word |= (uint32_t)table[x1[2]] << 16;
        word |= (uint32_t)table[x1[3]] << 24;
#endif
        *z4 ^= word;
    }

    // Handle single bytes
    const int offset = four;
    switch (bytes & 3)
    {
    case 3: z1[offset + 2] ^= table[x1[offset + 2]];
    case 2: z1[offset + 1] ^= table[x1[offset + 1]];
    case 1: z1[offset] ^= table[x1[offset]];
    default:
        break;
    }
}